

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void pre(c2m_ctx_t c2m_ctx)

{
  pre_ctx *ppVar1;
  FILE *__stream;
  unsigned_long uVar2;
  token_t ptVar3;
  size_t sVar4;
  token_t t;
  pre_ctx_t pre_ctx;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->pre_ctx;
  ppVar1->pre_last_token = (token_t)0x0;
  (ppVar1->actual_pre_pos).fname = (char *)0x0;
  (ppVar1->actual_pre_pos).lno = 0;
  (ppVar1->actual_pre_pos).ln_pos = 0;
  ppVar1->pre_out_token_func = common_pre_out;
  ppVar1->pptokens_num = 0;
  VARR_char_ptr_ttrunc(ppVar1->once_include_files,0);
  if (c2m_ctx->options->no_prepro_p == 0) {
    processing(c2m_ctx,0);
  }
  else {
    while ((ptVar3 = get_next_pptoken(c2m_ctx), (short)*(undefined4 *)ptVar3 != 0x13d &&
           ((short)*(undefined4 *)ptVar3 != 0x147))) {
      (*ppVar1->pre_out_token_func)(c2m_ctx,ptVar3);
    }
  }
  (*ppVar1->pre_out_token_func)(c2m_ctx,(token_t)0x0);
  if ((c2m_ctx->options->verbose_p != 0) && (c2m_ctx->options->message_file != (FILE *)0x0)) {
    __stream = (FILE *)c2m_ctx->options->message_file;
    uVar2 = ppVar1->pptokens_num;
    sVar4 = VARR_token_tlength(c2m_ctx->recorded_tokens);
    fprintf(__stream,"    preprocessor tokens -- %lu, parse tokens -- %lu\n",uVar2,sVar4);
  }
  return;
}

Assistant:

static void pre (c2m_ctx_t c2m_ctx) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;

  pre_last_token = NULL;
  actual_pre_pos.fname = NULL;
  actual_pre_pos.lno = 0;
  actual_pre_pos.ln_pos = 0;
  pre_out_token_func = common_pre_out;
  pptokens_num = 0;
  VARR_TRUNC (char_ptr_t, once_include_files, 0);
  if (!c2m_options->no_prepro_p) {
    processing (c2m_ctx, FALSE);
  } else {
    for (;;) {
      token_t t = get_next_pptoken (c2m_ctx);

      if (t->code == T_EOFILE || t->code == T_EOU) break;
      pre_out_token_func (c2m_ctx, t);
    }
  }
  pre_out_token_func (c2m_ctx, NULL);
  if (c2m_options->verbose_p && c2m_options->message_file != NULL)
    fprintf (c2m_options->message_file, "    preprocessor tokens -- %lu, parse tokens -- %lu\n",
             pptokens_num, (unsigned long) VARR_LENGTH (token_t, recorded_tokens));
}